

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O1

size_t __thiscall higan::TimeStamp::FormatToBuffer(TimeStamp *this,char *buffer,size_t len)

{
  int iVar1;
  tm *__tp;
  long local_30;
  time_t now_second;
  
  local_30 = this->microsecond_time_ / 1000000;
  if (0x1e847e < this->microsecond_time_ + 999999U) {
    __tp = localtime(&local_30);
    g_time_buffer_len = strftime(g_time_buffer,0x20,"%Y-%m-%d %H:%M:%S",__tp);
  }
  strcpy(buffer,g_time_buffer);
  iVar1 = snprintf(buffer + g_time_buffer_len,len - g_time_buffer_len,".%06ld",
                   this->microsecond_time_ % 1000000);
  return (long)iVar1 + g_time_buffer_len;
}

Assistant:

size_t TimeStamp::FormatToBuffer(char* buffer, size_t len) const
{
	time_t now_second = microsecond_time_ / MICROSECOND_PER_SECOND;
	if (g_last_second != now_second)
	{
		struct tm* now_tm = localtime(&now_second);
		g_time_buffer_len = strftime(g_time_buffer, sizeof g_time_buffer, "%Y-%m-%d %H:%M:%S", now_tm);
	}

	strcpy(buffer, g_time_buffer);
	int s_len = snprintf(buffer + g_time_buffer_len, len - g_time_buffer_len,
			".%06ld", microsecond_time_ % MICROSECOND_PER_SECOND);

	return g_time_buffer_len + s_len;
}